

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

size_t __thiscall Potassco::EnumClass::convert(EnumClass *this,char *x,int *out)

{
  bool bVar1;
  int iVar2;
  size_t s;
  StringSpan *in_RDX;
  int *in_RSI;
  StringSpan *in_RDI;
  Span<char> SVar3;
  StringSpan k;
  char *next;
  int cVal;
  undefined8 in_stack_ffffffffffffffa8;
  size_t sVar4;
  EnumClass *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffc0 [16];
  int *local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int *iKey;
  EnumClass *in_stack_fffffffffffffff8;
  
  iVar2 = Potassco::xconvert(in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0._0_8_,
                             &in_RDI->first,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  if ((iVar2 == 0) ||
     (bVar1 = isValid(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)),
     !bVar1)) {
    if (in_RSI == local_30) {
      iKey = in_RSI;
      s = strcspn((char *)in_RSI," ,=");
      SVar3 = toSpan<char>((char *)in_RSI,s);
      sVar4 = SVar3.size;
      bVar1 = detail::find_kv(in_stack_fffffffffffffff8,in_RDI,iKey,in_RDX,
                              (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (!bVar1) {
        sVar4 = 0;
      }
    }
    else {
      sVar4 = 0;
    }
  }
  else {
    *(undefined4 *)&in_RDX->first = in_stack_ffffffffffffffdc;
    sVar4 = (long)local_30 - (long)in_RSI;
  }
  return sVar4;
}

Assistant:

size_t EnumClass::convert(const char* x, int& out) const {
	int cVal; const char* next;
	if (xconvert(x, cVal, &next, ',') && isValid(cVal)) {
		out = cVal;
		return static_cast<size_t>(next - x);
	}
	else if (x == next) {
		StringSpan k = toSpan(x, std::strcspn(x, " ,="));
		return detail::find_kv(*this, &k, 0, 0, &out) ? k.size : 0;
	}
	else { return static_cast<size_t>(0); }
}